

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O1

void __thiscall Win32MakefileGenerator::processVars(Win32MakefileGenerator *this)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  QArrayDataPointer<ProString> *pQVar9;
  QArrayDataPointer<ProString> *pQVar10;
  ProStringList *pPVar11;
  ProStringList *pPVar12;
  QList<ProString> *pQVar13;
  pointer pQVar14;
  iterator this_00;
  iterator iVar15;
  QMakeProject *pQVar16;
  char *pcVar17;
  ProString *pPVar18;
  long in_FS_OFFSET;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  QStringView config_02;
  QStringView config_03;
  ProStringList ret;
  QStringBuilder<QLatin1String,_QString_&> local_140;
  ProKey local_128;
  ProString local_f8;
  ProString local_c8;
  ProString local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_98,"TEMPLATE");
  QMakeEvaluator::first(&local_68,&pQVar16->super_QMakeEvaluator,(ProKey *)&local_98);
  bVar5 = ProString::endsWith(&local_68,"aux",CaseSensitive);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar5) goto LAB_00251285;
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"TARGET");
  pQVar9 = (QArrayDataPointer<ProString> *)
           QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_68);
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_98,"QMAKE_ORIG_TARGET");
  pQVar10 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_98);
  QArrayDataPointer<ProString>::operator=(pQVar10,pQVar9);
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_c8,"PRL_TARGET");
  pQVar9 = (QArrayDataPointer<ProString> *)
           QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_c8);
  QArrayDataPointer<ProString>::operator=(pQVar9,pQVar10);
  if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_PROJECT_NAME");
  bVar5 = QMakeProject::isEmpty(pQVar16,(ProKey *)&local_68);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar5) {
    pQVar16 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_ORIG_TARGET");
    pQVar9 = (QArrayDataPointer<ProString> *)
             QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_68);
    pQVar16 = (this->super_MakefileGenerator).project;
    pcVar17 = "QMAKE_PROJECT_NAME";
LAB_00250404:
    ProKey::ProKey((ProKey *)&local_98,pcVar17);
    pQVar10 = (QArrayDataPointer<ProString> *)
              QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_98);
    QArrayDataPointer<ProString>::operator=(pQVar10,pQVar9);
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    pQVar16 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"TEMPLATE");
    QMakeEvaluator::first(&local_68,&pQVar16->super_QMakeEvaluator,(ProKey *)&local_98);
    bVar5 = ProString::startsWith(&local_68,"vc",CaseSensitive);
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar5) {
      pQVar16 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_68,"QMAKE_PROJECT_NAME");
      pQVar9 = (QArrayDataPointer<ProString> *)
               QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_68);
      pQVar16 = (this->super_MakefileGenerator).project;
      pcVar17 = "MAKEFILE";
      goto LAB_00250404;
    }
  }
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_INCDIR_POST");
  pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_68);
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_98,"QMAKE_INCDIR");
  pPVar12 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_98);
  pPVar18 = (pPVar11->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)pPVar12,pPVar18,
             pPVar18 + (pPVar11->super_QList<ProString>).d.size);
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_LIBDIR_POST");
  pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_68);
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_98,"QMAKE_LIBDIR");
  pPVar12 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_98);
  pPVar18 = (pPVar11->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)pPVar12,pPVar18,
             pPVar18 + (pPVar11->super_QList<ProString>).d.size);
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_INCDIR");
  pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_68);
  lVar1 = (pPVar11->super_QList<ProString>).d.size;
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (lVar1 != 0) {
    pQVar16 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_INCDIR");
    pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_68);
    pQVar16 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"INCLUDEPATH");
    pPVar12 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_98);
    pPVar18 = (pPVar11->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar12,pPVar18,
               pPVar18 + (pPVar11->super_QList<ProString>).d.size);
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"VERSION");
  pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_68);
  lVar1 = (pPVar11->super_QList<ProString>).d.size;
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (lVar1 != 0) {
    local_c8.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar16 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"VERSION");
    QMakeEvaluator::first(&local_68,&pQVar16->super_QMakeEvaluator,(ProKey *)&local_98);
    ProString::toQString(&local_f8.m_string,&local_68);
    QString::split(&local_c8,&local_f8,0x2e,0,1);
    if ((ProString *)local_f8.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((undefined1 *)local_c8.m_string.d.size != (undefined1 *)0x0) {
      pQVar16 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_68,"VER_MAJ");
      pQVar13 = &QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_68)->
                 super_QList<ProString>;
      pQVar14 = QList<QString>::data((QList<QString> *)&local_c8);
      ProString::ProString(&local_98,pQVar14);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar13,(pQVar13->d).size,&local_98);
      QList<ProString>::end(pQVar13);
      if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((undefined1 *)0x1 < (ulong)local_c8.m_string.d.size) {
      pQVar16 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_68,"VER_MIN");
      pQVar13 = &QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_68)->
                 super_QList<ProString>;
      pQVar14 = QList<QString>::data((QList<QString> *)&local_c8);
      ProString::ProString(&local_98,pQVar14 + 1);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar13,(pQVar13->d).size,&local_98);
      QList<ProString>::end(pQVar13);
      if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_c8);
  }
  pQVar16 = (this->super_MakefileGenerator).project;
  QVar19.m_data = (storage_type *)0x17;
  QVar19.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar19);
  pDVar2 = local_68.m_string.d.d;
  bVar5 = false;
  config.m_data = local_68.m_string.d.ptr;
  config.m_size = local_68.m_string.d.size;
  bVar6 = QMakeEvaluator::isActiveConfig(&pQVar16->super_QMakeEvaluator,config,false);
  bVar8 = false;
  if (!bVar6) {
    pQVar16 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"TARGET_VERSION_EXT");
    pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_68);
    if ((pPVar11->super_QList<ProString>).d.size == 0) {
      pQVar16 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_98,"VER_MAJ");
      pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_98);
      bVar8 = (pPVar11->super_QList<ProString>).d.size != 0;
      bVar5 = true;
    }
    else {
      bVar5 = false;
      bVar8 = false;
    }
  }
  if ((bVar5) && (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((!bVar6) && (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
    }
  }
  if (bVar8) {
    pQVar16 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_c8,"TARGET_VERSION_EXT");
    pQVar13 = &QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_c8)->
               super_QList<ProString>;
    pQVar16 = (this->super_MakefileGenerator).project;
    ProKey::ProKey(&local_128,"VER_MAJ");
    QMakeEvaluator::first(&local_f8,&pQVar16->super_QMakeEvaluator,&local_128);
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar13,(pQVar13->d).size,&local_f8);
    QList<ProString>::end(pQVar13);
    if ((ProString *)local_f8.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_128.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_128.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_128.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_128.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  fixTargetExt(this);
  processRcFileVar(this);
  local_128.super_ProString.m_string.d.d = (Data *)0x0;
  local_128.super_ProString.m_string.d.ptr = (char16_t *)0x0;
  local_128.super_ProString.m_string.d.size = 0;
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_c8,"QMAKE_LIBDIR");
  pQVar13 = &QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_c8)->
             super_QList<ProString>;
  if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  this_00 = QList<ProString>::begin(pQVar13);
  iVar15 = QList<ProString>::end(pQVar13);
  if (this_00.i != iVar15.i) {
    do {
      local_f8.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      ProString::toQString(&local_f8.m_string,this_00.i);
      if ((undefined1 *)local_f8.m_string.d.size != (undefined1 *)0x0) {
        cVar7 = QString::endsWith((QChar)(char16_t)&local_f8,0x5c);
        if (cVar7 != '\0') {
          QString::chop((longlong)&local_f8);
        }
        local_140.a.m_size = 2;
        local_140.a.m_data = "-L";
        local_140.b = &local_f8.m_string;
        ProString::ProString<QLatin1String,QString&>(&local_c8,&local_140);
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                  ((QMovableArrayOps<ProString> *)&local_128,
                   local_128.super_ProString.m_string.d.size,&local_c8);
        QList<ProString>::end((QList<ProString> *)&local_128);
        if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if ((ProString *)local_f8.m_string.d.d != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      this_00.i = this_00.i + 1;
      iVar15 = QList<ProString>::end(pQVar13);
    } while (this_00.i != iVar15.i);
  }
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_c8,"LIBS");
  pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_c8);
  if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_f8.m_string.d.d = local_128.super_ProString.m_string.d.d;
  local_f8.m_string.d.ptr = local_128.super_ProString.m_string.d.ptr;
  local_f8.m_string.d.size = local_128.super_ProString.m_string.d.size;
  if (&(local_128.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_128.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pPVar18 = (pPVar11->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)&local_f8,pPVar18,
             pPVar18 + (pPVar11->super_QList<ProString>).d.size);
  qVar4 = local_f8.m_string.d.size;
  pcVar3 = local_f8.m_string.d.ptr;
  pDVar2 = local_f8.m_string.d.d;
  local_f8.m_string.d.d = (Data *)0x0;
  local_f8.m_string.d.ptr = (storage_type_conflict *)0x0;
  local_f8.m_string.d.size = 0;
  local_c8.m_string.d.d = (Data *)(pPVar11->super_QList<ProString>).d.d;
  local_c8.m_string.d.ptr = (char16_t *)(pPVar11->super_QList<ProString>).d.ptr;
  (pPVar11->super_QList<ProString>).d.d = (Data *)pDVar2;
  (pPVar11->super_QList<ProString>).d.ptr = (ProString *)pcVar3;
  local_c8.m_string.d.size = (pPVar11->super_QList<ProString>).d.size;
  (pPVar11->super_QList<ProString>).d.size = qVar4;
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_c8);
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_f8);
  pQVar16 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_c8,"TEMPLATE");
  pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_c8);
  bVar5 = ProStringList::contains(pPVar11,"app",CaseSensitive);
  if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar16 = (this->super_MakefileGenerator).project;
  if (bVar5) {
    ProKey::ProKey((ProKey *)&local_c8,"QMAKE_CFLAGS_APP");
    pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_c8);
    pQVar16 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_f8,"QMAKE_CFLAGS");
    pPVar12 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_f8);
    pPVar18 = (pPVar11->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar12,pPVar18,
               pPVar18 + (pPVar11->super_QList<ProString>).d.size);
    if ((ProString *)local_f8.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar16 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_c8,"QMAKE_CXXFLAGS_APP");
    pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_c8);
    pQVar16 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_f8,"QMAKE_CXXFLAGS");
    pPVar12 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_f8);
    pPVar18 = (pPVar11->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar12,pPVar18,
               pPVar18 + (pPVar11->super_QList<ProString>).d.size);
    if ((ProString *)local_f8.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar16 = (this->super_MakefileGenerator).project;
    pcVar17 = "QMAKE_LFLAGS_APP";
LAB_00251072:
    ProKey::ProKey((ProKey *)&local_c8,pcVar17);
    pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_c8);
    pQVar16 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_f8,"QMAKE_LFLAGS");
    pPVar12 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_f8);
    pPVar18 = (pPVar11->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar12,pPVar18,
               pPVar18 + (pPVar11->super_QList<ProString>).d.size);
    if ((ProString *)local_f8.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    pPVar18 = &local_c8;
    ProKey::ProKey((ProKey *)pPVar18,"TEMPLATE");
    pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)pPVar18);
    bVar5 = ProStringList::contains(pPVar11,"lib",CaseSensitive);
    if (bVar5) {
      pQVar16 = (this->super_MakefileGenerator).project;
      QVar20.m_data = (storage_type *)0x3;
      QVar20.m_size = (qsizetype)&local_f8;
      QString::fromUtf8(QVar20);
      pPVar18 = (ProString *)local_f8.m_string.d.d;
      config_00.m_data = local_f8.m_string.d.ptr;
      config_00.m_size = local_f8.m_string.d.size;
      bVar8 = QMakeEvaluator::isActiveConfig(&pQVar16->super_QMakeEvaluator,config_00,false);
    }
    else {
      bVar8 = false;
    }
    if (bVar5 && pPVar18 != (ProString *)0x0) {
      LOCK();
      *(int *)&(pPVar18->m_string).d.d = *(int *)&(pPVar18->m_string).d.d + -1;
      UNLOCK();
      if (*(int *)&(pPVar18->m_string).d.d == 0) {
        QArrayData::deallocate((QArrayData *)pPVar18,2,0x10);
      }
    }
    if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar8 != false) {
      pQVar16 = (this->super_MakefileGenerator).project;
      pPVar18 = &local_c8;
      QVar21.m_data = (storage_type *)0x6;
      QVar21.m_size = (qsizetype)pPVar18;
      QString::fromUtf8(QVar21);
      pDVar2 = local_c8.m_string.d.d;
      config_01.m_data = local_c8.m_string.d.ptr;
      config_01.m_size = local_c8.m_string.d.size;
      bVar5 = QMakeEvaluator::isActiveConfig(&pQVar16->super_QMakeEvaluator,config_01,false);
      if (bVar5) {
        pQVar16 = (this->super_MakefileGenerator).project;
        QVar22.m_data = (storage_type *)0x1c;
        QVar22.m_size = (qsizetype)&local_c8;
        QString::fromUtf8(QVar22);
        pPVar18 = (ProString *)local_c8.m_string.d.d;
        config_02.m_data = local_c8.m_string.d.ptr;
        config_02.m_size = local_c8.m_string.d.size;
        bVar8 = QMakeEvaluator::isActiveConfig(&pQVar16->super_QMakeEvaluator,config_02,false);
        bVar8 = !bVar8;
      }
      else {
        bVar8 = true;
      }
      if (bVar5 && pPVar18 != (ProString *)0x0) {
        LOCK();
        *(int *)&(pPVar18->m_string).d.d = *(int *)&(pPVar18->m_string).d.d + -1;
        UNLOCK();
        if (*(int *)&(pPVar18->m_string).d.d == 0) {
          QArrayData::deallocate((QArrayData *)pPVar18,2,0x10);
        }
      }
      if ((ProString *)pDVar2 != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d =
             *(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
        }
      }
      if (bVar8) {
        pQVar16 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_c8,"QMAKE_CFLAGS_SHLIB");
        pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_c8);
        pQVar16 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_f8,"QMAKE_CFLAGS");
        pPVar12 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_f8);
        pPVar18 = (pPVar11->super_QList<ProString>).d.ptr;
        QtPrivate::QCommonArrayOps<ProString>::growAppend
                  ((QCommonArrayOps<ProString> *)pPVar12,pPVar18,
                   pPVar18 + (pPVar11->super_QList<ProString>).d.size);
        if ((ProString *)local_f8.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar16 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_c8,"QMAKE_CXXFLAGS_SHLIB");
        pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_c8);
        pQVar16 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_f8,"QMAKE_CXXFLAGS");
        pPVar12 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_f8);
        pPVar18 = (pPVar11->super_QList<ProString>).d.ptr;
        QtPrivate::QCommonArrayOps<ProString>::growAppend
                  ((QCommonArrayOps<ProString> *)pPVar12,pPVar18,
                   pPVar18 + (pPVar11->super_QList<ProString>).d.size);
        if ((ProString *)local_f8.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      pQVar16 = (this->super_MakefileGenerator).project;
      QVar23.m_data = (storage_type *)0x6;
      QVar23.m_size = (qsizetype)&local_c8;
      QString::fromUtf8(QVar23);
      pDVar2 = local_c8.m_string.d.d;
      config_03.m_data = local_c8.m_string.d.ptr;
      config_03.m_size = local_c8.m_string.d.size;
      bVar5 = QMakeEvaluator::isActiveConfig(&pQVar16->super_QMakeEvaluator,config_03,false);
      if ((ProString *)pDVar2 != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d =
             *(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
        }
      }
      pQVar16 = (this->super_MakefileGenerator).project;
      if (bVar5) {
        ProKey::ProKey((ProKey *)&local_c8,"QMAKE_CFLAGS_PLUGIN");
        pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_c8);
        pQVar16 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_f8,"QMAKE_CFLAGS");
        pPVar12 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_f8);
        pPVar18 = (pPVar11->super_QList<ProString>).d.ptr;
        QtPrivate::QCommonArrayOps<ProString>::growAppend
                  ((QCommonArrayOps<ProString> *)pPVar12,pPVar18,
                   pPVar18 + (pPVar11->super_QList<ProString>).d.size);
        if ((ProString *)local_f8.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar16 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_c8,"QMAKE_CXXFLAGS_PLUGIN");
        pPVar11 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_c8);
        pQVar16 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_f8,"QMAKE_CXXFLAGS");
        pPVar12 = QMakeEvaluator::valuesRef(&pQVar16->super_QMakeEvaluator,(ProKey *)&local_f8);
        pPVar18 = (pPVar11->super_QList<ProString>).d.ptr;
        QtPrivate::QCommonArrayOps<ProString>::growAppend
                  ((QCommonArrayOps<ProString> *)pPVar12,pPVar18,
                   pPVar18 + (pPVar11->super_QList<ProString>).d.size);
        if ((ProString *)local_f8.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_f8.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((ProString *)local_c8.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_c8.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar16 = (this->super_MakefileGenerator).project;
        pcVar17 = "QMAKE_LFLAGS_PLUGIN";
      }
      else {
        pcVar17 = "QMAKE_LFLAGS_SHLIB";
      }
      goto LAB_00251072;
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_128);
LAB_00251285:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::processVars()
{
    if (project->first("TEMPLATE").endsWith("aux"))
        return;

    project->values("PRL_TARGET") =
            project->values("QMAKE_ORIG_TARGET") = project->values("TARGET");
    if (project->isEmpty("QMAKE_PROJECT_NAME"))
        project->values("QMAKE_PROJECT_NAME") = project->values("QMAKE_ORIG_TARGET");
    else if (project->first("TEMPLATE").startsWith("vc"))
        project->values("MAKEFILE") = project->values("QMAKE_PROJECT_NAME");

    project->values("QMAKE_INCDIR") += project->values("QMAKE_INCDIR_POST");
    project->values("QMAKE_LIBDIR") += project->values("QMAKE_LIBDIR_POST");

    if (!project->values("QMAKE_INCDIR").isEmpty())
        project->values("INCLUDEPATH") += project->values("QMAKE_INCDIR");

    if (!project->values("VERSION").isEmpty()) {
        QStringList l = project->first("VERSION").toQString().split('.');
        if (l.size() > 0)
            project->values("VER_MAJ").append(l[0]);
        if (l.size() > 1)
            project->values("VER_MIN").append(l[1]);
    }

    // TARGET_VERSION_EXT will be used to add a version number onto the target name
    if (!project->isActiveConfig("skip_target_version_ext")
        && project->values("TARGET_VERSION_EXT").isEmpty()
        && !project->values("VER_MAJ").isEmpty())
        project->values("TARGET_VERSION_EXT").append(project->first("VER_MAJ"));

    fixTargetExt();
    processRcFileVar();

    ProStringList libs;
    ProStringList &libDir = project->values("QMAKE_LIBDIR");
    for (ProStringList::Iterator libDir_it = libDir.begin(); libDir_it != libDir.end(); ++libDir_it) {
        QString lib = (*libDir_it).toQString();
        if (!lib.isEmpty()) {
            if (lib.endsWith('\\'))
                lib.chop(1);
            libs << QLatin1String("-L") + lib;
        }
    }
    ProStringList &qmklibs = project->values("LIBS");
    qmklibs = libs + qmklibs;

    if (project->values("TEMPLATE").contains("app")) {
        project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_APP");
        project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_APP");
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_APP");
    } else if (project->values("TEMPLATE").contains("lib") && project->isActiveConfig("dll")) {
        if(!project->isActiveConfig("plugin") || !project->isActiveConfig("plugin_no_share_shlib_cflags")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_SHLIB");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_SHLIB");
        }
        if (project->isActiveConfig("plugin")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_PLUGIN");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_PLUGIN");
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_PLUGIN");
        } else {
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SHLIB");
        }
    }
}